

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

string_t duckdb::StringVector::AddString(Vector *vector,string *data)

{
  uint uVar1;
  undefined8 in_RCX;
  pointer __src;
  anon_union_16_2_67f50693_for_value aVar2;
  string_t data_00;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 local_14;
  
  __src = (data->_M_dataplus)._M_p;
  uVar1 = (uint)data->_M_string_length;
  if (uVar1 < 0xd) {
    local_14 = 0;
    uStack_1c = 0;
    uStack_18 = 0;
    if (uVar1 == 0) {
      __src = (pointer)0x0;
    }
    else {
      switchD_00917c1c::default(&uStack_1c,__src,(ulong)(uVar1 & 0xf));
      __src = (pointer)CONCAT44(local_14,uStack_18);
    }
  }
  else {
    uStack_1c = *(undefined4 *)__src;
  }
  data_00.value.pointer.ptr = (char *)in_RCX;
  data_00.value._0_8_ = __src;
  aVar2.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       AddString((StringVector *)vector,(Vector *)CONCAT44(uStack_1c,uVar1),data_00);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar2.pointer;
}

Assistant:

string_t StringVector::AddString(Vector &vector, const string &data) {
	return StringVector::AddString(vector, string_t(data.c_str(), UnsafeNumericCast<uint32_t>(data.size())));
}